

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  bool bVar2;
  bool bVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  stbi_uc sVar6;
  stbi_uc sVar7;
  stbi_uc sVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  stbi_uc sVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  stbi_uc *__s;
  stbi_uc *__s_00;
  char *pcVar18;
  int iVar19;
  undefined4 in_register_0000000c;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint n;
  uint uVar24;
  int iVar25;
  uint uVar26;
  stbi__context *unaff_R12;
  uint uVar27;
  size_t __size;
  long in_FS_OFFSET;
  stbi__context *local_80;
  uint local_78;
  uint local_74;
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar25 = stbi__gif_header(s,g,comp,0);
    if (iVar25 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar25 = g->w;
    iVar16 = g->h;
    iVar19 = stbi__mad3sizes_valid(4,iVar25,iVar16,0);
    if (iVar19 == 0) {
      pcVar18 = "GIF image is too large";
    }
    else {
      iVar16 = iVar16 * iVar25;
      __size = (size_t)(iVar16 * 4);
      __s = (stbi_uc *)malloc(__size);
      g->out = __s;
      __s_00 = (stbi_uc *)malloc(__size);
      g->background = __s_00;
      local_80 = (stbi__context *)(long)iVar16;
      unaff_R12 = (stbi__context *)malloc((size_t)local_80);
      g->history = (stbi_uc *)unaff_R12;
      pcVar18 = "Out of memory";
      if ((__s != (stbi_uc *)0x0) && (unaff_R12 != (stbi__context *)0x0 && __s_00 != (stbi_uc *)0x0)
         ) {
        memset(__s,0,__size);
        memset(__s_00,0,__size);
        memset(unaff_R12,0,(size_t)local_80);
        goto LAB_00191b9f;
      }
    }
    *(char **)(in_FS_OFFSET + -0x20) = pcVar18;
    unaff_R12 = (stbi__context *)0x0;
  }
  else {
    uVar24 = (uint)g->eflags >> 2 & 7;
    uVar15 = g->h * g->w;
    uVar17 = 2;
    if (uVar24 != 3) {
      uVar17 = uVar24;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar17 = uVar24;
    }
    if (uVar17 == 3) {
      if (0 < (int)uVar15) {
        uVar20 = 0;
        do {
          if (g->history[uVar20] != '\0') {
            *(undefined4 *)(g->out + uVar20 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar20 * 4);
          }
          uVar20 = uVar20 + 1;
        } while (uVar15 != uVar20);
      }
    }
    else if ((uVar17 == 2) && (0 < (int)uVar15)) {
      uVar20 = 0;
      do {
        if (g->history[uVar20] != '\0') {
          *(undefined4 *)(g->out + uVar20 * 4) = *(undefined4 *)(g->background + uVar20 * 4);
        }
        uVar20 = uVar20 + 1;
      } while (uVar15 != uVar20);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
LAB_00191b9f:
    memset(g->history,0,(long)g->h * (long)g->w);
    do {
      sVar4 = stbi__get8(s);
      if (sVar4 == '!') {
        sVar4 = stbi__get8(s);
        if (sVar4 == 0xf9) {
          bVar12 = stbi__get8(s);
          if (bVar12 != 4) {
            stbi__skip(s,(uint)bVar12);
            bVar2 = true;
            goto LAB_00191e02;
          }
          bVar12 = stbi__get8(s);
          g->eflags = (uint)bVar12;
          bVar12 = stbi__get8(s);
          bVar13 = stbi__get8(s);
          g->delay = ((uint)bVar13 * 0x200 + (uint)bVar12 * 2) * 5;
          if (-1 < (long)g->transparent) {
            g->pal[g->transparent][3] = 0xff;
          }
          if ((g->eflags & 1) != 0) {
            bVar12 = stbi__get8(s);
            g->transparent = (uint)bVar12;
            g->pal[bVar12][3] = '\0';
            goto LAB_0019218c;
          }
          if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00191d98:
            s->img_buffer = s->img_buffer + 1;
          }
          else {
            iVar25 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
            if (0 < iVar25) goto LAB_00191d98;
            s->img_buffer = s->img_buffer_end;
            (*(s->io).skip)(s->io_user_data,1 - iVar25);
          }
          g->transparent = -1;
        }
LAB_0019218c:
        bVar12 = stbi__get8(s);
        bVar2 = true;
        while (bVar12 != 0) {
          stbi__skip(s,(uint)bVar12);
          bVar12 = stbi__get8(s);
        }
      }
      else if (sVar4 == ';') {
        bVar2 = false;
        unaff_R12 = s;
      }
      else {
        if (sVar4 == ',') {
          sVar4 = stbi__get8(s);
          sVar5 = stbi__get8(s);
          sVar6 = stbi__get8(s);
          local_80 = (stbi__context *)CONCAT71(local_80._1_7_,sVar6);
          sVar7 = stbi__get8(s);
          sVar8 = stbi__get8(s);
          sVar9 = stbi__get8(s);
          sVar10 = stbi__get8(s);
          sVar11 = stbi__get8(s);
          iVar25 = (uint)CONCAT11(sVar5,sVar4) + (uint)CONCAT11(sVar9,sVar8);
          if (g->w < iVar25) goto LAB_00191ded;
          iVar16 = (uint)CONCAT11(sVar11,sVar10) + (uint)CONCAT11(sVar7,sVar6);
          if (g->h < iVar16) goto LAB_00191ded;
          iVar19 = g->w * 4;
          g->line_size = iVar19;
          iVar23 = (uint)CONCAT11(sVar5,sVar4) << 2;
          g->start_x = iVar23;
          iVar21 = (uint)CONCAT11(sVar7,sVar6) * iVar19;
          g->start_y = iVar21;
          g->max_x = iVar25 * 4;
          iVar16 = iVar16 * iVar19;
          g->max_y = iVar16;
          g->cur_x = iVar23;
          if (CONCAT11(sVar9,sVar8) != 0) {
            iVar16 = iVar21;
          }
          g->cur_y = iVar16;
          bVar12 = stbi__get8(s);
          g->lflags = (uint)bVar12;
          if ((bVar12 & 0x40) == 0) {
            g->step = g->line_size;
            g->parse = 0;
          }
          else {
            g->step = g->line_size << 3;
            g->parse = 3;
          }
          if ((char)bVar12 < '\0') {
            iVar25 = -1;
            if ((g->eflags & 1) != 0) {
              iVar25 = g->transparent;
            }
            stbi__gif_parse_colortable(s,g->lpal,2 << (bVar12 & 7),iVar25);
            g->color_table = g->lpal[0];
          }
          else {
            if ((g->flags & 0x80) == 0) goto LAB_00191ded;
            g->color_table = g->pal[0];
          }
          bVar12 = stbi__get8(s);
          if (bVar12 < 0xd) {
            uVar17 = 1 << (bVar12 & 0x1f);
            uVar20 = 0;
            do {
              g->codes[uVar20].prefix = -1;
              g->codes[uVar20].first = (stbi_uc)uVar20;
              g->codes[uVar20].suffix = (stbi_uc)uVar20;
              uVar20 = uVar20 + 1;
            } while (uVar17 != uVar20);
            uVar26 = (2 << (bVar12 & 0x1f)) - 1;
            local_78 = 0xffffffff;
            bVar2 = true;
            n = 0;
            uVar24 = 0;
            iVar16 = 0;
            uVar15 = uVar17 + 2;
            local_74 = uVar26;
            iVar25 = bVar12 + 1;
            do {
              for (; iVar19 = iVar16 - iVar25, iVar16 < iVar25; iVar16 = iVar16 + 8) {
                if (n == 0) {
                  bVar13 = stbi__get8(s);
                  if (bVar13 == 0) {
                    local_80 = (stbi__context *)g->out;
                    goto LAB_001920fe;
                  }
                  n = (uint)bVar13;
                }
                n = n - 1;
                bVar13 = stbi__get8(s);
                uVar24 = uVar24 | (uint)bVar13 << ((byte)iVar16 & 0x1f);
              }
              bVar13 = (byte)iVar25;
              uVar27 = uVar24 & local_74;
              bVar3 = true;
              if (uVar27 == uVar17) {
                bVar2 = false;
                local_78 = 0xffffffff;
                iVar25 = bVar12 + 1;
                local_74 = uVar26;
                uVar15 = uVar17 + 2;
              }
              else if (uVar27 == uVar17 + 1) {
                while( true ) {
                  stbi__skip(s,n);
                  bVar14 = stbi__get8(s);
                  if (bVar14 == 0) break;
                  n = (uint)bVar14;
                }
                local_80 = (stbi__context *)g->out;
                n = 0;
                bVar3 = false;
              }
              else {
                if ((int)uVar15 < (int)uVar27) {
                  *(char **)(in_FS_OFFSET + -0x20) = "Corrupt GIF";
                }
                else if (bVar2) {
                  *(char **)(in_FS_OFFSET + -0x20) = "Corrupt GIF";
                  bVar2 = true;
                }
                else if ((int)local_78 < 0) {
                  if (uVar27 != uVar15) goto LAB_00192094;
                  *(char **)(in_FS_OFFSET + -0x20) = "Corrupt GIF";
                  bVar2 = false;
                }
                else {
                  uVar22 = uVar15 + 1;
                  if ((int)uVar15 < 0x2000) {
                    g->codes[(int)uVar15].prefix = (stbi__int16)local_78;
                    sVar4 = g->codes[local_78].first;
                    g->codes[(int)uVar15].first = sVar4;
                    if (uVar27 != uVar22) {
                      sVar4 = g->codes[(int)uVar27].first;
                    }
                    g->codes[(int)uVar15].suffix = sVar4;
                    uVar15 = uVar22;
LAB_00192094:
                    stbi__out_gif_code(g,(stbi__uint16)uVar27);
                    if ((int)uVar15 < 0x1000 && (uVar15 & local_74) == 0) {
                      local_74 = ~(-1 << ((byte)(iVar25 + 1) & 0x1f));
                      iVar25 = iVar25 + 1;
                    }
                    bVar2 = false;
                    bVar3 = true;
                    local_78 = uVar27;
                    goto LAB_00191fee;
                  }
                  *(char **)(in_FS_OFFSET + -0x20) = "Corrupt GIF";
                  bVar2 = false;
                  uVar15 = uVar22;
                }
                bVar3 = false;
                local_80 = (stbi__context *)0x0;
              }
LAB_00191fee:
              uVar24 = (int)uVar24 >> (bVar13 & 0x1f);
              iVar16 = iVar19;
            } while (bVar3);
          }
          else {
            local_80 = (stbi__context *)0x0;
          }
LAB_001920fe:
          if (local_80 != (stbi__context *)0x0) {
            unaff_R12 = local_80;
            if ((psVar1 == (stbi_uc *)0x0) &&
               (uVar17 = g->h * g->w, 0 < (int)uVar17 && 0 < g->bgindex)) {
              uVar20 = 0;
              do {
                if (g->history[uVar20] == '\0') {
                  g->pal[g->bgindex][3] = 0xff;
                  *(stbi_uc (*) [4])(g->out + uVar20 * 4) = g->pal[g->bgindex];
                }
                uVar20 = uVar20 + 1;
                bVar2 = false;
              } while (uVar17 != uVar20);
            }
            else {
              bVar2 = false;
            }
            goto LAB_00191e02;
          }
        }
        else {
LAB_00191ded:
          *(char **)(in_FS_OFFSET + -0x20) = "Corrupt GIF";
        }
        bVar2 = false;
        unaff_R12 = (stbi__context *)0x0;
      }
LAB_00191e02:
    } while (bVar2);
  }
  return (stbi_uc *)unaff_R12;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose;
   int first_frame;
   int pi;
   int pcount;
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0;
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background;
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame.
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1;
   } else {
      // second frame - how do we dispose of the previous one?
      dispose = (g->eflags & 0x1C) >> 2;
      pcount = g->w * g->h;

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 );
            }
         }
      } else if (dispose == 2) {
         // restore what was changed last frame to background before that frame;
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 );
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame;
      memcpy( g->background, g->out, 4 * g->w * g->h );
   }

   // clear my history;
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s);
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");

            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame,
            pcount = g->w * g->h;
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be;
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 );
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s);
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255;
                  }
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0;
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1);
                     g->transparent = -1;
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            }
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}